

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nalUnits.cpp
# Opt level: O2

void __thiscall
SPSUnit::insertHrdData
          (SPSUnit *this,int bitPos,int nal_hrd_len,int vcl_hrd_len,bool addVuiHeader,
          HRDParams *params)

{
  uint8_t *puVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint8_t *__dest;
  undefined3 in_register_00000081;
  int iVar5;
  ulong uVar6;
  int iVar7;
  BitStreamWriter writer;
  BitStreamReader reader;
  
  uVar3 = (this->super_NALUnit).m_nalBufferLen;
  __dest = (uint8_t *)operator_new__((ulong)(uVar3 + 0x40));
  iVar7 = bitPos >> 3;
  puVar1 = (this->super_NALUnit).m_nalBuffer;
  memcpy(__dest,puVar1,(ulong)uVar3);
  reader.super_BitStream.m_totalBits = 0;
  reader.m_curVal = 0;
  reader.m_bitLeft = 0;
  reader.super_BitStream.m_buffer = (uint *)0x0;
  reader.super_BitStream.m_initBuffer = (uint *)0x0;
  BitStreamReader::setBuffer(&reader,puVar1 + iVar7,puVar1 + uVar3);
  writer.super_BitStream.m_totalBits = 0;
  writer.m_curVal = 0;
  writer.m_bitWrited = 0;
  writer.super_BitStream.m_buffer = (uint *)0x0;
  writer.super_BitStream.m_initBuffer = (uint *)0x0;
  BitStreamWriter::setBuffer
            (&writer,__dest + iVar7,__dest + (ulong)(this->super_NALUnit).m_nalBufferLen + 0x40);
  uVar3 = BitStreamReader::getBits(&reader,bitPos & 7U);
  BitStreamWriter::putBits(&writer,bitPos & 7U,uVar3);
  if (CONCAT31(in_register_00000081,addVuiHeader) == 0) {
    BitStreamWriter::putBit(&writer,1);
    bVar2 = BitStreamReader::getBit(&reader);
    if (bVar2) {
      uVar6 = 0;
      if (0 < (int)((long)nal_hrd_len / 0x20)) {
        uVar6 = (long)nal_hrd_len / 0x20 & 0xffffffff;
      }
      while (iVar5 = (int)uVar6, uVar6 = (ulong)(iVar5 - 1), iVar5 != 0) {
        uVar3 = BitStreamReader::getBits(&reader,0x20);
        BitStreamWriter::putBits(&writer,0x20,uVar3);
      }
      uVar3 = BitStreamReader::getBits(&reader,nal_hrd_len % 0x20);
      BitStreamWriter::putBits(&writer,nal_hrd_len % 0x20,uVar3);
    }
    else {
      serializeHRDParameters(&writer,params);
    }
    BitStreamWriter::putBit(&writer,1);
    bVar2 = BitStreamReader::getBit(&reader);
    if (bVar2) {
      uVar6 = 0;
      if (0 < (int)((long)vcl_hrd_len / 0x20)) {
        uVar6 = (long)vcl_hrd_len / 0x20 & 0xffffffff;
      }
      while (iVar5 = (int)uVar6, uVar6 = (ulong)(iVar5 - 1), iVar5 != 0) {
        uVar3 = BitStreamReader::getBits(&reader,0x20);
        BitStreamWriter::putBits(&writer,0x20,uVar3);
      }
      uVar3 = BitStreamReader::getBits(&reader,vcl_hrd_len % 0x20);
      BitStreamWriter::putBits(&writer,vcl_hrd_len % 0x20,uVar3);
    }
    else {
      serializeHRDParameters(&writer,params);
    }
    if (vcl_hrd_len != 0 || nal_hrd_len != 0) goto LAB_001cc599;
    uVar3 = this->low_delay_hrd_flag;
  }
  else {
    BitStreamReader::skipBit(&reader);
    BitStreamWriter::putBit(&writer,1);
    uVar3 = 0;
    BitStreamWriter::putBit(&writer,0);
    BitStreamWriter::putBit(&writer,0);
    BitStreamWriter::putBit(&writer,0);
    BitStreamWriter::putBit(&writer,0);
    this->timing_info_present_flag = 1;
    this->fixed_frame_rate_flag = 1;
    BitStreamWriter::putBit(&writer,1);
    BitStreamWriter::putBits(&writer,0x20,this->num_units_in_tick);
    BitStreamWriter::putBits(&writer,0x20,this->time_scale);
    BitStreamWriter::putBit(&writer,1);
    BitStreamWriter::putBit(&writer,1);
    serializeHRDParameters(&writer,&this->nalHrdParams);
    BitStreamWriter::putBit(&writer,1);
    serializeHRDParameters(&writer,&this->nalHrdParams);
    BitStreamWriter::putBit(&writer,this->low_delay_hrd_flag);
    BitStreamWriter::putBit(&writer,0);
  }
  BitStreamWriter::putBit(&writer,uVar3);
LAB_001cc599:
  for (uVar3 = ((this->full_sps_bit_len - (bitPos & 0xfffffff8U)) + reader.m_bitLeft +
               ((int)reader.super_BitStream.m_initBuffer - (int)reader.super_BitStream.m_buffer) * 8
               ) - 0x20; 7 < uVar3; uVar3 = uVar3 - 8) {
    uVar4 = BitStreamReader::getBits(&reader,8);
    BitStreamWriter::putBits(&writer,8,uVar4);
  }
  if (uVar3 != 0) {
    uVar4 = BitStreamReader::getBits(&reader,uVar3);
    BitStreamWriter::putBits(&writer,uVar3,uVar4);
  }
  this->full_sps_bit_len =
       (bitPos & 0xfffffff8U) + writer.m_bitWrited +
       ((int)writer.super_BitStream.m_buffer - (int)writer.super_BitStream.m_initBuffer) * 8;
  NALUnit::write_rbsp_trailing_bits(&writer);
  BitStreamWriter::flushBits(&writer);
  (this->super_NALUnit).m_nalBufferLen =
       (int)(((int)writer.super_BitStream.m_buffer - (int)writer.super_BitStream.m_initBuffer) * 8 +
            writer.m_bitWrited) / 8 + iVar7;
  puVar1 = (this->super_NALUnit).m_nalBuffer;
  if (puVar1 != (uint8_t *)0x0) {
    operator_delete__(puVar1);
  }
  (this->super_NALUnit).m_nalBuffer = __dest;
  return;
}

Assistant:

void SPSUnit::insertHrdData(const int bitPos, const int nal_hrd_len, const int vcl_hrd_len, const bool addVuiHeader,
                            const HRDParams& params)
{
    // replace hrd parameters not implemented. only insert
    static constexpr int EXTRA_SPACE = 64;

    const auto newNalBuffer = new uint8_t[m_nalBufferLen + EXTRA_SPACE];

    const int beforeBytes = bitPos >> 3;
    memcpy(newNalBuffer, m_nalBuffer, m_nalBufferLen);

    BitStreamReader reader{};
    reader.setBuffer(m_nalBuffer + beforeBytes, m_nalBuffer + m_nalBufferLen);
    BitStreamWriter writer{};
    writer.setBuffer(newNalBuffer + beforeBytes, newNalBuffer + m_nalBufferLen + EXTRA_SPACE);
    unsigned tmpVal = reader.getBits(bitPos & 7);
    writer.putBits(bitPos & 7, tmpVal);

    if (addVuiHeader)
    {
        reader.skipBit();  // old vui present header
        writer.putBit(1);  // enable vui parameters
        writer.putBit(0);  // no aspect ratio info
        writer.putBit(0);  // overscan_info_present_flag
        writer.putBit(0);  // video_signal_type_present_flag
        writer.putBit(0);  // chroma_loc_info_present_flag

        timing_info_present_flag = 1;
        fixed_frame_rate_flag = 1;
        writer.putBit(1);  // timing info present flag
        writer.putBits(32, num_units_in_tick);
        writer.putBits(32, time_scale);
        writer.putBit(1);  // fixed framerate flag

        writer.putBit(1);  // enable nal_hrd_params flags here
        serializeHRDParameters(writer, nalHrdParams);

        writer.putBit(1);  // enable vcl_hrd_params flags here
        serializeHRDParameters(writer, nalHrdParams);

        writer.putBit(low_delay_hrd_flag);
        writer.putBit(0);  // pic_struct_present_flag
        writer.putBit(0);  // bitstream_restriction_flag
    }
    else
    {
        writer.putBit(1);  // enable nal_hrd_params flags here
        if (reader.getBit())
        {  // source nal_hrd_parameters_present_flag
            // nal hrd already exists, copy from a source stream
            for (int i = 0; i < nal_hrd_len / 32; ++i) writer.putBits(32, reader.getBits(32));
            writer.putBits(nal_hrd_len % 32, reader.getBits(nal_hrd_len % 32));
        }
        else
        {
            serializeHRDParameters(writer, params);
        }

        writer.putBit(1);  // enable nal_vcl_params flags here
        if (reader.getBit())
        {  // source vcl_hrd_parameters_present_flag
            // vcl hrd already exists, copy from a source stream
            for (int i = 0; i < vcl_hrd_len / 32; ++i) writer.putBits(32, reader.getBits(32));
            writer.putBits(vcl_hrd_len % 32, reader.getBits(vcl_hrd_len % 32));
        }
        else
        {
            serializeHRDParameters(writer, params);
        }

        if (nal_hrd_len == 0 && vcl_hrd_len == 0)
            writer.putBit(low_delay_hrd_flag);  // absent in the source stream, add
    }

    // copy end of SPS
    unsigned bitRest = full_sps_bit_len - reader.getBitsCount() - beforeBytes * 8;
    for (; bitRest >= 8; bitRest -= 8)
    {
        tmpVal = reader.getBits(8);
        writer.putBits(8, tmpVal);
    }
    if (bitRest > 0)
    {
        tmpVal = reader.getBits(bitRest);
        writer.putBits(bitRest, tmpVal);
    }

    full_sps_bit_len = writer.getBitsCount() + beforeBytes * 8;

    write_rbsp_trailing_bits(writer);
    writer.flushBits();
    m_nalBufferLen = writer.getBitsCount() / 8 + beforeBytes;

    delete[] m_nalBuffer;
    m_nalBuffer = newNalBuffer;
}